

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibi.cpp
# Opt level: O0

bool find_chibi_build_root(char *source_path,char *build_root,int build_root_size)

{
  bool bVar1;
  char *pcVar2;
  char *term;
  char root_path [4096];
  char current_path [4096];
  int build_root_size_local;
  char *build_root_local;
  char *source_path_local;
  
  bVar1 = chibi::copy_string(root_path + 0xff8,0x1000,source_path);
  if (bVar1) {
    if (build_root_size < 1) {
      __assert_fail("build_root_size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marcel303[P]chibi/chibi.cpp"
                    ,0x59e,"bool find_chibi_build_root(const char *, char *, const int)");
    }
    *build_root = '\0';
    while (bVar1 = chibi::concat((char *)&term,0x1000,root_path + 0xff8,"/chibi-root.txt",
                                 (char *)0x0,(char *)0x0), bVar1) {
      bVar1 = file_exist((char *)&term);
      if ((bVar1) && (bVar1 = chibi::copy_string(build_root,build_root_size,(char *)&term), !bVar1))
      {
        report_error((char *)0x0,"failed to copy path");
        return false;
      }
      pcVar2 = strrchr(root_path + 0xff8,0x2f);
      if (pcVar2 == (char *)0x0) {
        if (*build_root == '\0') {
          return false;
        }
        return true;
      }
      *pcVar2 = '\0';
    }
    report_error((char *)0x0,"failed to create absolute path");
  }
  else {
    report_error((char *)0x0,"failed to copy path");
  }
  return false;
}

Assistant:

bool find_chibi_build_root(const char * source_path, char * build_root, const int build_root_size)
{
	// recursively find build_root
	
	char current_path[PATH_MAX];
	if (!copy_string(current_path, sizeof(current_path), source_path))
	{
		report_error(nullptr, "failed to copy path");
		return false;
	}
	
	assert(build_root_size > 0);
	build_root[0] = 0;

	for (;;)
	{
		char root_path[PATH_MAX];
		if (!concat(root_path, sizeof(root_path), current_path, "/chibi-root.txt"))
		{
			report_error(nullptr, "failed to create absolute path");
			return false;
		}

		if (file_exist(root_path))
		{
			if (!copy_string(build_root, build_root_size, root_path))
			{
				report_error(nullptr, "failed to copy path");
				return false;
			}
		}
		
		char * term = strrchr(current_path, '/');

		if (term == nullptr)
			break;
		else
			*term = 0;
	}
	
	if (build_root[0] == 0)
		return false;
	
	return true;
}